

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemarena.h
# Opt level: O2

bool __thiscall cookmem::FixedArena::freeSegment(FixedArena *this,void *ptr,size_t size)

{
  byte bVar1;
  
  bVar1 = this->m_size == size & this->m_page == ptr & this->m_used;
  if (bVar1 == 1) {
    this->m_used = false;
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool
    freeSegment (void* ptr, std::size_t size)
    {
        if (!m_used || ptr != m_page || size != m_size)
        {
            return true;
        }
        m_used = false;
        return false;
    }